

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O1

void container_suite::test_object_bool_two(void)

{
  char cVar1;
  size_type sVar2;
  bool bVar3;
  encoder_type encoder;
  ostringstream result;
  size_type local_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  long local_1c8 [2];
  undefined **local_1b8;
  ostringstream *local_1b0;
  long local_190 [4];
  int aiStack_170 [20];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  local_1b8 = &PTR__base_00119b70;
  bVar3 = *(int *)((long)aiStack_170 + *(long *)(local_190[0] + -0x18)) == 0;
  local_1b0 = (ostringstream *)local_190;
  if (bVar3) {
    local_1e0 = CONCAT71(local_1e0._1_7_,0x7b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)&local_1e0,1);
  }
  local_1d8._M_len = (size_t)bVar3;
  local_1e0 = CONCAT44(local_1e0._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::begin_object>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3bd,"void container_suite::test_object_bool_two()",&local_1d8,&local_1e0);
  local_1d8._M_len = 5;
  local_1d8._M_str = "false";
  local_1e0 = trial::protocol::json::detail::basic_encoder<char,24ul>::
              string_value<std::basic_string_view<char,std::char_traits<char>>>
                        ((basic_encoder<char,24ul> *)&local_1b8,&local_1d8);
  local_1d8._M_len = CONCAT44(local_1d8._M_len._4_4_,7);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(\"false\")","7",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3be,"void container_suite::test_object_bool_two()",&local_1e0,&local_1d8);
  cVar1 = (*(code *)local_1b8[2])(&local_1b8,1);
  if (cVar1 != '\0') {
    (*(code *)local_1b8[3])(&local_1b8,0x3a);
  }
  local_1d8._M_len = (size_t)(cVar1 != '\0');
  local_1e0 = CONCAT44(local_1e0._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::detail::name_separator>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3bf,"void container_suite::test_object_bool_two()",&local_1d8,&local_1e0);
  local_1d8._M_len = 5;
  local_1d8._M_str =
       (char *)&trial::protocol::json::detail::basic_encoder<char,24ul>::value(bool)::false_text;
  cVar1 = (*(code *)local_1b8[2])(&local_1b8,5);
  if (cVar1 == '\0') {
    sVar2 = 0;
  }
  else {
    sVar2 = 5;
    (*(code *)local_1b8[4])(&local_1b8,&local_1d8);
  }
  local_1d8._M_len = CONCAT44(local_1d8._M_len._4_4_,5);
  local_1e0 = sVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(false)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3c0,"void container_suite::test_object_bool_two()",&local_1e0,&local_1d8);
  cVar1 = (*(code *)local_1b8[2])(&local_1b8,1);
  if (cVar1 != '\0') {
    (*(code *)local_1b8[3])(&local_1b8,0x2c);
  }
  local_1d8._M_len = (size_t)(cVar1 != '\0');
  local_1e0 = CONCAT44(local_1e0._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::detail::value_separator>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3c1,"void container_suite::test_object_bool_two()",&local_1d8,&local_1e0);
  local_1d8._M_len = 4;
  local_1d8._M_str = "true";
  local_1e0 = trial::protocol::json::detail::basic_encoder<char,24ul>::
              string_value<std::basic_string_view<char,std::char_traits<char>>>
                        ((basic_encoder<char,24ul> *)&local_1b8,&local_1d8);
  local_1d8._M_len = CONCAT44(local_1d8._M_len._4_4_,6);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(\"true\")","6",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3c2,"void container_suite::test_object_bool_two()",&local_1e0,&local_1d8);
  cVar1 = (*(code *)local_1b8[2])(&local_1b8,1);
  if (cVar1 != '\0') {
    (*(code *)local_1b8[3])(&local_1b8,0x3a);
  }
  local_1d8._M_len = (size_t)(cVar1 != '\0');
  local_1e0 = CONCAT44(local_1e0._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::detail::name_separator>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3c3,"void container_suite::test_object_bool_two()",&local_1d8,&local_1e0);
  local_1d8._M_len = 4;
  local_1d8._M_str =
       (char *)&trial::protocol::json::detail::basic_encoder<char,24ul>::value(bool)::true_text;
  cVar1 = (*(code *)local_1b8[2])(&local_1b8,4);
  if (cVar1 == '\0') {
    sVar2 = 0;
  }
  else {
    sVar2 = 4;
    (*(code *)local_1b8[4])(&local_1b8,&local_1d8);
  }
  local_1d8._M_len = CONCAT44(local_1d8._M_len._4_4_,4);
  local_1e0 = sVar2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(true)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3c4,"void container_suite::test_object_bool_two()",&local_1e0,&local_1d8);
  cVar1 = (*(code *)local_1b8[2])(&local_1b8,1);
  if (cVar1 != '\0') {
    (*(code *)local_1b8[3])(&local_1b8,0x7d);
  }
  local_1d8._M_len = (size_t)(cVar1 != '\0');
  local_1e0 = CONCAT44(local_1e0._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::end_object>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3c5,"void container_suite::test_object_bool_two()",&local_1d8,&local_1e0);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[28]>
            ("result.str()","\"{\\\"false\\\":false,\\\"true\\\":true}\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3c6,"void container_suite::test_object_bool_two()",&local_1d8,
             "{\"false\":false,\"true\":true}");
  if ((long *)local_1d8._M_len != local_1c8) {
    operator_delete((void *)local_1d8._M_len,local_1c8[0] + 1);
  }
  (*(code *)*local_1b8)();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void test_object_bool_two()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::begin_object>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value("false"), 7);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::detail::name_separator>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(false), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::detail::value_separator>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value("true"), 6);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::detail::name_separator>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(true), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::end_object>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "{\"false\":false,\"true\":true}");
}